

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_extract2.c
# Opt level: O2

int archive_read_extract2(archive *_a,archive_entry *entry,archive *ad)

{
  int iVar1;
  int iVar2;
  wchar_t wVar3;
  int64_t iVar4;
  archive_read_extract *paVar5;
  ssize_t sVar6;
  char *pcVar7;
  int iVar8;
  size_t local_48;
  void *buff;
  int64_t offset;
  
  if (*(int *)&_a[1].vtable != 0) {
    archive_write_disk_set_skip_file
              (ad,*(int64_t *)&_a[1].archive_format,(int64_t)_a[1].archive_format_name);
  }
  iVar1 = archive_write_header(ad,entry);
  if (iVar1 != 0) {
    if (iVar1 < -0x13) {
      iVar1 = -0x14;
    }
    archive_copy_error(_a,ad);
    goto LAB_001eb6ed;
  }
  wVar3 = archive_entry_size_is_set(entry);
  if (wVar3 == L'\0') {
LAB_001eb74b:
    paVar5 = __archive_read_get_extract((archive_read *)_a);
    if (paVar5 == (archive_read_extract *)0x0) {
      iVar1 = -0x1e;
      goto LAB_001eb6ed;
    }
    while( true ) {
      iVar1 = archive_read_data_block(_a,&buff,&local_48,&offset);
      if (iVar1 != 0) break;
      sVar6 = archive_write_data_block(ad,buff,local_48,offset);
      iVar1 = (int)sVar6;
      if (iVar1 != 0) {
        if (iVar1 < -0x13) {
          iVar1 = -0x14;
        }
        iVar2 = archive_errno(ad);
        pcVar7 = archive_error_string(ad);
        archive_set_error(_a,iVar2,"%s",pcVar7);
        goto LAB_001eb6ed;
      }
      if (paVar5->extract_progress != (_func_void_void_ptr *)0x0) {
        (*paVar5->extract_progress)(paVar5->extract_progress_user_data);
      }
    }
    if (iVar1 != 1) goto LAB_001eb6ed;
  }
  else {
    iVar4 = archive_entry_size(entry);
    if (0 < iVar4) goto LAB_001eb74b;
  }
  iVar1 = 0;
LAB_001eb6ed:
  iVar2 = archive_write_finish_entry(ad);
  if (iVar1 == 0 && iVar2 != 0) {
    archive_copy_error(_a,ad);
  }
  iVar8 = -0x14;
  if (-0x14 < iVar2) {
    iVar8 = iVar2;
  }
  if (iVar1 <= iVar8) {
    iVar8 = iVar1;
  }
  return iVar8;
}

Assistant:

int
archive_read_extract2(struct archive *_a, struct archive_entry *entry,
    struct archive *ad)
{
	struct archive_read *a = (struct archive_read *)_a;
	int r, r2;

	/* Set up for this particular entry. */
	if (a->skip_file_set)
		archive_write_disk_set_skip_file(ad,
		    a->skip_file_dev, a->skip_file_ino);
	r = archive_write_header(ad, entry);
	if (r < ARCHIVE_WARN)
		r = ARCHIVE_WARN;
	if (r != ARCHIVE_OK)
		/* If _write_header failed, copy the error. */
 		archive_copy_error(&a->archive, ad);
	else if (!archive_entry_size_is_set(entry) || archive_entry_size(entry) > 0)
		/* Otherwise, pour data into the entry. */
		r = copy_data(_a, ad);
	r2 = archive_write_finish_entry(ad);
	if (r2 < ARCHIVE_WARN)
		r2 = ARCHIVE_WARN;
	/* Use the first message. */
	if (r2 != ARCHIVE_OK && r == ARCHIVE_OK)
		archive_copy_error(&a->archive, ad);
	/* Use the worst error return. */
	if (r2 < r)
		r = r2;
	return (r);
}